

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_threading.hpp
# Opt level: O3

unordered_map<const_void_*,_chaiscript::detail::Stack_Holder,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>_>
* chaiscript::detail::threading::Thread_Storage<chaiscript::detail::Stack_Holder>::t(void)

{
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-0x11] == '\0') {
    t();
  }
  return (unordered_map<const_void_*,_chaiscript::detail::Stack_Holder,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>_>
          *)(*in_FS_OFFSET + -0xc0);
}

Assistant:

static std::unordered_map<const void *, T> &t() noexcept {
      static thread_local std::unordered_map<const void *, T> my_t;
      return my_t;
    }